

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::truncated_normal_dist<double>>
               (truncated_normal_dist<double> *d)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  param_type *ppVar3;
  truncated_normal_dist<double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  truncated_normal_dist<double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd58;
  Flags in_stack_fffffffffffffd5c;
  undefined6 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  SourceLineInfo *this;
  AssertionHandler *this_00;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  param_type *in_stack_fffffffffffffd88;
  AssertionHandler *in_stack_fffffffffffffd90;
  SourceLineInfo local_268;
  StringRef local_258;
  param_type *in_stack_fffffffffffffde8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf0;
  stringstream local_1c0 [16];
  AssertionHandler local_1b0 [5];
  truncated_normal_dist<double> *local_8;
  
  local_8 = in_RDI;
  trng::truncated_normal_dist<double>::param_type::param_type
            ((param_type *)
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)));
  std::__cxx11::stringstream::stringstream(local_1c0);
  this_00 = local_1b0;
  ppVar3 = trng::truncated_normal_dist<double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd90,
                   in_stack_fffffffffffffd88);
  trng::operator>>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  trng::truncated_normal_dist<double>::truncated_normal_dist
            ((truncated_normal_dist<double> *)
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),
             (param_type *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_258 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffd67,
                                          CONCAT16(in_stack_fffffffffffffd66,
                                                   in_stack_fffffffffffffd60)),
                         CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  this = &local_268;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffffd80;
  capturedExpression.m_start = (char *)ppVar3;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffffd87;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffd67,
                      CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),
             capturedExpression,in_stack_fffffffffffffd5c);
  uVar1 = trng::operator==((truncated_normal_dist<double> *)
                           CONCAT17(in_stack_fffffffffffffd67,
                                    CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60)),
                           (truncated_normal_dist<double> *)
                           CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffd90,(ExprLhs<bool> *)in_stack_fffffffffffffd88);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffd60)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffd60)));
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}